

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

void __thiscall QKeySequenceEdit::setKeySequence(QKeySequenceEdit *this,QKeySequence *keySequence)

{
  uint uVar1;
  QKeySequenceEditPrivate *this_00;
  QLineEdit *this_01;
  char cVar2;
  int i_1;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  QKeySequenceEditPrivate::resetState(this_00);
  cVar2 = QKeySequence::operator==(&this_00->keySequence,keySequence);
  if (cVar2 == '\0') {
    uVar3 = QKeySequence::count();
    uVar1 = this_00->maximumSequenceLength;
    if ((int)uVar1 < (int)uVar3) {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,
                 "QKeySequenceEdit: setting a key sequence of length %d when maximumSequenceLength is %d, truncating."
                 ,(ulong)uVar3);
      uVar1 = this_00->maximumSequenceLength;
    }
    uVar6 = (ulong)uVar3;
    if ((int)uVar1 < (int)uVar3) {
      uVar6 = (ulong)uVar1;
    }
    this_00->keyNum = (int)uVar6;
    for (lVar7 = 0; lVar5 = (long)(int)uVar6, lVar7 < lVar5; lVar7 = lVar7 + 1) {
      iVar4 = QKeySequence::operator[]((uint)keySequence);
      this_00->key[lVar7].combination = iVar4;
      uVar6 = (ulong)(uint)this_00->keyNum;
    }
    for (; lVar5 < 4; lVar5 = lVar5 + 1) {
      this_00->key[lVar5].combination = 0;
    }
    QKeySequenceEditPrivate::rebuildKeySequence(this_00);
    this_01 = this_00->lineEdit;
    QKeySequence::toString((SequenceFormat)&local_58);
    QLineEdit::setText(this_01,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    keySequenceChanged(this,&this_00->keySequence);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::setKeySequence(const QKeySequence &keySequence)
{
    Q_D(QKeySequenceEdit);

    d->resetState();

    if (d->keySequence == keySequence)
        return;

    const auto desiredCount = keySequence.count();
    if (desiredCount > d->maximumSequenceLength) {
        qWarning("QKeySequenceEdit: setting a key sequence of length %d "
                 "when maximumSequenceLength is %d, truncating.",
                 desiredCount, d->maximumSequenceLength);
    }

    d->keyNum = std::min(desiredCount, d->maximumSequenceLength);
    for (int i = 0; i < d->keyNum; ++i)
        d->key[i] = keySequence[i];
    for (int i = d->keyNum; i < QKeySequencePrivate::MaxKeyCount; ++i)
        d->key[i] = QKeyCombination::fromCombined(0);

    d->rebuildKeySequence();

    d->lineEdit->setText(d->keySequence.toString(QKeySequence::NativeText));

    emit keySequenceChanged(d->keySequence);
}